

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

size_t __thiscall
helics::ActionMessage::from_vector(ActionMessage *this,vector<char,_std::allocator<char>_> *data)

{
  byte *data_00;
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  size_t sVar4;
  string_view data_01;
  
  data_00 = (byte *)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                    super__Vector_impl_data._M_start;
  sVar4 = fromByteArray(this,data_00,
                        (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)data_00);
  if (sVar4 == 0) {
    pcVar1 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    pcVar2 = (data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
             ._M_finish;
    if (((pcVar1 != pcVar2) && (*pcVar1 == '{')) &&
       (data_01._M_len = (long)pcVar2 - (long)pcVar1, data_01._M_str = pcVar1,
       bVar3 = from_json_string(this,data_01), bVar3)) {
      return (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
    }
    sVar4 = 0;
  }
  return sVar4;
}

Assistant:

std::size_t ActionMessage::from_vector(const std::vector<char>& data)
{
    const std::size_t bytesUsed =
        fromByteArray(reinterpret_cast<const std::byte*>(data.data()), data.size());
    if (bytesUsed == 0 && !data.empty() && data.front() == '{') {
        if (from_json_string(std::string_view(data.data(), data.size()))) {
            return data.size();
        }
    }
    return bytesUsed;
}